

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::readDecNumberToBcd(DecimalQuantity *this,DecNum *decnum)

{
  uint capacity;
  decNumber *pdVar1;
  int32_t i;
  long lVar2;
  uint8_t *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pdVar1 = (decnum->fData).ptr;
  capacity = pdVar1->digits;
  if ((int)capacity < 0x11) {
    puVar3 = pdVar1->lsu;
    uVar5 = 0;
    uVar7 = (ulong)capacity;
    if ((int)capacity < 1) {
      uVar7 = uVar5;
    }
    uVar6 = 0;
    for (; uVar7 * 4 != uVar5; uVar5 = uVar5 + 4) {
      uVar6 = uVar6 | (ulong)*puVar3 << ((byte)uVar5 & 0x3f);
      puVar3 = puVar3 + 1;
    }
    (this->fBCD).bcdLong = uVar6;
    iVar4 = pdVar1->digits;
  }
  else {
    ensureCapacity(this,capacity);
    for (lVar2 = 0; iVar4 = pdVar1->digits, lVar2 < iVar4; lVar2 = lVar2 + 1) {
      (this->fBCD).bcdBytes.ptr[lVar2] = pdVar1->lsu[lVar2];
    }
  }
  this->scale = pdVar1->exponent;
  this->precision = iVar4;
  return;
}

Assistant:

void DecimalQuantity::readDecNumberToBcd(const DecNum& decnum) {
    const decNumber* dn = decnum.getRawDecNumber();
    if (dn->digits > 16) {
        ensureCapacity(dn->digits);
        for (int32_t i = 0; i < dn->digits; i++) {
            fBCD.bcdBytes.ptr[i] = dn->lsu[i];
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < dn->digits; i++) {
            result |= static_cast<uint64_t>(dn->lsu[i]) << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = dn->exponent;
    precision = dn->digits;
}